

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

Literal * wasm::Properties::getLiteral(Literal *__return_storage_ptr__,Expression *curr)

{
  Name func;
  int32_t value;
  Literal local_d0;
  Literal local_b8;
  RefAs *local_a0;
  RefAs *r_1;
  string local_88;
  StringConst *local_68;
  StringConst *s;
  Const *c_1;
  I31New *i;
  size_t local_48;
  char *local_40;
  RefFunc *local_38;
  RefFunc *r;
  RefNull *local_28;
  RefNull *n;
  Const *c;
  Expression *curr_local;
  
  c = (Const *)curr;
  curr_local = (Expression *)__return_storage_ptr__;
  n = (RefNull *)Expression::dynCast<wasm::Const>(curr);
  if ((Const *)n == (Const *)0x0) {
    local_28 = Expression::dynCast<wasm::RefNull>((Expression *)c);
    if (local_28 == (RefNull *)0x0) {
      local_38 = Expression::dynCast<wasm::RefFunc>((Expression *)c);
      if (local_38 == (RefFunc *)0x0) {
        c_1 = (Const *)Expression::dynCast<wasm::I31New>((Expression *)c);
        if (c_1 == (Const *)0x0) {
          local_68 = Expression::dynCast<wasm::StringConst>((Expression *)c);
          if (local_68 == (StringConst *)0x0) {
            local_a0 = Expression::dynCast<wasm::RefAs>((Expression *)c);
            if (local_a0 == (RefAs *)0x0) {
LAB_014c3ac4:
              handle_unreachable("non-constant expression",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/properties.h"
                                 ,0x85);
            }
            if (local_a0->op == ExternExternalize) {
              getLiteral(&local_b8,local_a0->value);
              wasm::Literal::externalize(__return_storage_ptr__,&local_b8);
              wasm::Literal::~Literal(&local_b8);
            }
            else {
              if (local_a0->op != ExternInternalize) goto LAB_014c3ac4;
              getLiteral(&local_d0,local_a0->value);
              wasm::Literal::internalize(__return_storage_ptr__,&local_d0);
              wasm::Literal::~Literal(&local_d0);
            }
          }
          else {
            IString::toString_abi_cxx11_(&local_88,&(local_68->string).super_IString);
            wasm::Literal::Literal(__return_storage_ptr__,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
          }
        }
        else {
          s = (StringConst *)
              Expression::dynCast<wasm::Const>
                        ((Expression *)
                         (c_1->value).field_0.gcData.
                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if ((Const *)s == (Const *)0x0) {
            s = (StringConst *)0x0;
            goto LAB_014c3ac4;
          }
          value = wasm::Literal::geti32(&((Const *)s)->value);
          wasm::Literal::makeI31(__return_storage_ptr__,value);
        }
      }
      else {
        local_48 = (local_38->func).super_IString.str._M_len;
        local_40 = (local_38->func).super_IString.str._M_str;
        i = (I31New *)
            wasm::Type::getHeapType
                      (&(local_38->super_SpecificExpression<(wasm::Expression::Id)43>).
                        super_Expression.type);
        func.super_IString.str._M_str = local_40;
        func.super_IString.str._M_len = local_48;
        wasm::Literal::Literal(__return_storage_ptr__,func,(HeapType)i);
      }
    }
    else {
      r = (RefFunc *)
          (local_28->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id;
      wasm::Literal::Literal(__return_storage_ptr__,(Type)r);
    }
  }
  else {
    wasm::Literal::Literal(__return_storage_ptr__,&((Const *)n)->value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literal getLiteral(const Expression* curr) {
  if (auto* c = curr->dynCast<Const>()) {
    return c->value;
  } else if (auto* n = curr->dynCast<RefNull>()) {
    return Literal(n->type);
  } else if (auto* r = curr->dynCast<RefFunc>()) {
    return Literal(r->func, r->type.getHeapType());
  } else if (auto* i = curr->dynCast<I31New>()) {
    if (auto* c = i->value->dynCast<Const>()) {
      return Literal::makeI31(c->value.geti32());
    }
  } else if (auto* s = curr->dynCast<StringConst>()) {
    return Literal(s->string.toString());
  } else if (auto* r = curr->dynCast<RefAs>()) {
    if (r->op == ExternExternalize) {
      return getLiteral(r->value).externalize();
    } else if (r->op == ExternInternalize) {
      return getLiteral(r->value).internalize();
    }
  }
  WASM_UNREACHABLE("non-constant expression");
}